

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

double __thiscall libDAI::HAK::doGBP(HAK *this)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  size_t sVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  void *pvVar9;
  R_nb_t *this_00;
  size_type sVar10;
  Region *this_01;
  GraphicalModel *pGVar11;
  reference puVar12;
  FRegion *this_02;
  clock_t cVar13;
  void *pvVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long *in_RDI;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  Factor new_belief;
  size_t i_1;
  R_nb_cit gamma;
  Factor Qa_new;
  R_nb_cit alpha_2;
  R_nb_cit alpha_1;
  Factor Qb_new;
  R_nb_cit alpha;
  size_t beta_1;
  Diffs diffs;
  size_t i;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  size_t beta;
  clock_t tic;
  undefined4 in_stack_fffffffffffff858;
  NormType in_stack_fffffffffffff85c;
  RegionGraph *in_stack_fffffffffffff860;
  TFactor<double> *in_stack_fffffffffffff868;
  HAK *in_stack_fffffffffffff870;
  TFactor<double> *in_stack_fffffffffffff880;
  TFactor<double> *in_stack_fffffffffffff888;
  Diffs *in_stack_fffffffffffff890;
  size_type in_stack_fffffffffffff898;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_fffffffffffff8a0;
  TFactor<double> *in_stack_fffffffffffff8a8;
  TFactor<double> *in_stack_fffffffffffff8b8;
  TFactor<double> *in_stack_fffffffffffff8c0;
  TFactor<double> *in_stack_fffffffffffff8c8;
  double in_stack_fffffffffffff8d8;
  Diffs *in_stack_fffffffffffff8e0;
  TFactor<double> *in_stack_fffffffffffff980;
  TFactor<double> *in_stack_fffffffffffff988;
  undefined1 local_450 [56];
  ulong local_418;
  unsigned_long *local_410;
  unsigned_long *local_360;
  unsigned_long *local_358;
  unsigned_long *local_350;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_348 [15];
  unsigned_long *local_2d0;
  unsigned_long *local_2c8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2c0 [22];
  int local_20c;
  unsigned_long *local_208;
  unsigned_long *local_1c8;
  unsigned_long *local_1c0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b8 [8];
  unsigned_long *local_178;
  unsigned_long *local_100;
  unsigned_long *local_f8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f0;
  void *local_e8;
  undefined1 local_a8 [56];
  ulong local_70;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_68;
  ulong local_50;
  clock_t local_48;
  string local_30 [40];
  double local_8;
  undefined1 extraout_var [56];
  
  lVar2 = (**(code **)(*in_RDI + 0x30))();
  if (lVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)(*in_RDI + 0x48))();
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,"...");
    std::__cxx11::string::~string(local_30);
  }
  uVar4 = (**(code **)(*in_RDI + 0x30))();
  if (2 < uVar4) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  local_48 = toc();
  local_50 = 0;
  while( true ) {
    uVar4 = local_50;
    (**(code **)(*in_RDI + 0x28))();
    sVar5 = RegionGraph::nr_IRs((RegionGraph *)0xb4938b);
    if (sVar5 <= uVar4) break;
    local_50 = local_50 + 1;
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb493c0)
  ;
  plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar6 + 0x28))();
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_70 = 0;
  while( true ) {
    uVar4 = local_70;
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar7 = (**(code **)(*plVar6 + 0x28))();
    if (uVar7 <= uVar4) break;
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar8 = (**(code **)(*plVar6 + 0x30))(plVar6,local_70);
    (**(code **)(*in_RDI + 0x50))(local_a8,in_RDI,uVar8);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffff860,
               (value_type *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
    local_70 = local_70 + 1;
  }
  plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar6 + 0x28))();
  Diffs::Diffs(in_stack_fffffffffffff890,(long)in_stack_fffffffffffff888,
               (double)in_stack_fffffffffffff880);
  in_RDI[0x45] = 0;
  while( true ) {
    bVar1 = false;
    if ((ulong)in_RDI[0x45] < (ulong)in_RDI[0x3f]) {
      dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      bVar1 = (double)in_RDI[0x3e] < dVar15;
    }
    if (!bVar1) break;
    local_e8 = (void *)0x0;
    while( true ) {
      pvVar14 = local_e8;
      (**(code **)(*in_RDI + 0x28))();
      pvVar9 = (void *)RegionGraph::nr_IRs((RegionGraph *)0xb4966d);
      if (pvVar9 <= pvVar14) break;
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbIR(in_stack_fffffffffffff860,
                        CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      local_f8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffff860,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::nbIR(in_stack_fffffffffffff860,
                          CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        local_100 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff860,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        if (!bVar1) break;
        puVar12 = __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_f0);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   (in_RDI + 0x46),*puVar12);
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::IR(in_stack_fffffffffffff860,
                        CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        TFactor<double>::marginal
                  (in_stack_fffffffffffff8c8,&in_stack_fffffffffffff8c0->_vs,
                   SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x38,0));
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_f0);
        muba(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
             (size_t)in_stack_fffffffffffff860);
        TFactor<double>::divided_by(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_f0);
        muab(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
             (size_t)in_stack_fffffffffffff860);
        TFactor<double>::operator=
                  ((TFactor<double> *)in_stack_fffffffffffff860,
                   (TFactor<double> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858))
        ;
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_f0);
        muab(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
             (size_t)in_stack_fffffffffffff860);
        pGVar11 = (GraphicalModel *)(**(code **)(*in_RDI + 0x28))();
        GraphicalModel::normType(pGVar11);
        TFactor<double>::normalize
                  ((TFactor<double> *)in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
        local_178 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff868,
                                 (int)((ulong)in_stack_fffffffffffff860 >> 0x20));
      }
      TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffff870);
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbIR(in_stack_fffffffffffff860,
                        CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      local_1c0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffff860,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      while( true ) {
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::nbIR(in_stack_fffffffffffff860,
                          CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        local_1c8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff860,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_1b8);
        muab(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
             (size_t)in_stack_fffffffffffff860);
        auVar17._0_8_ = (**(code **)(*in_RDI + 0x28))();
        auVar17._8_56_ = extraout_var;
        auVar16 = auVar17._0_16_;
        this_00 = RegionGraph::nbIR(in_stack_fffffffffffff860,
                                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
        vcvtusi2sd_avx512f(auVar16,sVar10);
        (**(code **)(*in_RDI + 0x28))();
        pvVar14 = local_e8;
        this_01 = RegionGraph::IR(in_stack_fffffffffffff860,
                                  CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        Region::c(this_01,pvVar14,extraout_RDX);
        TFactor<double>::operator^(in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0);
        TFactor<double>::operator*=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
        local_208 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff868,
                                 (int)((ulong)in_stack_fffffffffffff860 >> 0x20));
      }
      pGVar11 = (GraphicalModel *)(**(code **)(*in_RDI + 0x28))();
      GraphicalModel::normType(pGVar11);
      TFactor<double>::normalize
                ((TFactor<double> *)in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
      bVar1 = TFactor<double>::hasNaNs((TFactor<double> *)0xb49c73);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"HAK::doGBP:  Qb_new has NaNs!");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_8 = NAN;
        local_20c = 1;
      }
      else {
        if (((*(byte *)(in_RDI + 0x42) & 1) == 0) &&
           (((double)in_RDI[0x41] != 0.0 || (NAN((double)in_RDI[0x41]))))) {
          TFactor<double>::operator^(in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0);
          std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
          operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                     (in_RDI + 0x49),(size_type)local_e8);
          TFactor<double>::operator^(in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0);
          TFactor<double>::operator*(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
          std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
          operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                     (in_RDI + 0x49),(size_type)local_e8);
          TFactor<double>::operator=
                    ((TFactor<double> *)in_stack_fffffffffffff860,
                     (TFactor<double> *)
                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
          TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
          TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
        }
        else {
          std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
          operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                     (in_RDI + 0x49),(size_type)local_e8);
          TFactor<double>::operator=
                    ((TFactor<double> *)in_stack_fffffffffffff860,
                     (TFactor<double> *)
                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        }
        (**(code **)(*in_RDI + 0x28))();
        RegionGraph::nbIR(in_stack_fffffffffffff860,
                          CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        local_2c8 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffff860,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
        while( true ) {
          (**(code **)(*in_RDI + 0x28))();
          RegionGraph::nbIR(in_stack_fffffffffffff860,
                            CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          local_2d0 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffff860,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          if (!bVar1) break;
          std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
          operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                     (in_RDI + 0x49),(size_type)local_e8);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_2c0);
          muab(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
               (size_t)in_stack_fffffffffffff860);
          TFactor<double>::divided_by(in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_2c0);
          muba(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
               (size_t)in_stack_fffffffffffff860);
          TFactor<double>::operator=
                    ((TFactor<double> *)in_stack_fffffffffffff860,
                     (TFactor<double> *)
                     CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
          (**(code **)(*in_RDI + 0x28))();
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_2c0);
          RegionGraph::OR(in_stack_fffffffffffff860,
                          CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          TFactor<double>::TFactor
                    ((TFactor<double> *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
          (**(code **)(*in_RDI + 0x28))();
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_2c0);
          RegionGraph::nbOR(in_stack_fffffffffffff860,
                            CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          local_350 = (unsigned_long *)
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          __gnu_cxx::
          __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          ::__normal_iterator<unsigned_long*>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffff860,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          while( true ) {
            (**(code **)(*in_RDI + 0x28))();
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(local_2c0);
            RegionGraph::nbOR(in_stack_fffffffffffff860,
                              CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
            local_358 = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffff860,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
            if (!bVar1) break;
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(local_348);
            __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(local_2c0);
            muba(in_stack_fffffffffffff870,(size_t)in_stack_fffffffffffff868,
                 (size_t)in_stack_fffffffffffff860);
            TFactor<double>::operator*=(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
            local_360 = (unsigned_long *)
                        __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)in_stack_fffffffffffff868,
                                     (int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          }
          (**(code **)(*in_RDI + 0x28))();
          puVar12 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(local_2c0);
          pvVar14 = (void *)*puVar12;
          this_02 = RegionGraph::OR(in_stack_fffffffffffff860,
                                    CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          FRegion::c(this_02,pvVar14,extraout_RDX_00);
          TFactor<double>::operator^=
                    ((TFactor<double> *)in_stack_fffffffffffff860,
                     (Real)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
          pGVar11 = (GraphicalModel *)(**(code **)(*in_RDI + 0x28))();
          GraphicalModel::normType(pGVar11);
          TFactor<double>::normalize
                    ((TFactor<double> *)in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
          bVar1 = TFactor<double>::hasNaNs((TFactor<double> *)0xb4a2ff);
          if (bVar1) {
            in_stack_fffffffffffff988 =
                 (TFactor<double> *)
                 std::operator<<((ostream *)&std::cout,"HAK::doGBP:  Qa_new has NaNs!");
            std::ostream::operator<<
                      (in_stack_fffffffffffff988,std::endl<char,std::char_traits<char>>);
            local_8 = NAN;
            local_20c = 1;
          }
          else {
            if (((*(byte *)(in_RDI + 0x42) & 1) == 0) &&
               (((double)in_RDI[0x41] != 0.0 || (NAN((double)in_RDI[0x41]))))) {
              TFactor<double>::operator^(in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0);
              puVar12 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(local_2c0);
              std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
              operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)(in_RDI + 0x46),*puVar12);
              TFactor<double>::operator^(in_stack_fffffffffffff8a8,(Real)in_stack_fffffffffffff8a0);
              TFactor<double>::operator*(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
              puVar12 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(local_2c0);
              std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
              operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)(in_RDI + 0x46),*puVar12);
              TFactor<double>::operator=
                        ((TFactor<double> *)in_stack_fffffffffffff860,
                         (TFactor<double> *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
              TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
              TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
              TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
            }
            else {
              in_stack_fffffffffffff980 = (TFactor<double> *)(in_RDI + 0x46);
              puVar12 = __gnu_cxx::
                        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator*(local_2c0);
              std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
              operator[]((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          *)in_stack_fffffffffffff980,*puVar12);
              TFactor<double>::operator=
                        ((TFactor<double> *)in_stack_fffffffffffff860,
                         (TFactor<double> *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
            }
            local_20c = 0;
          }
          TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
          if (local_20c != 0) goto LAB_00b4a5bb;
          local_410 = (unsigned_long *)
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)in_stack_fffffffffffff868,
                                   (int)((ulong)in_stack_fffffffffffff860 >> 0x20));
        }
        local_20c = 0;
      }
LAB_00b4a5bb:
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
      if (local_20c != 0) goto LAB_00b4abb2;
      local_e8 = (void *)((long)local_e8 + 1);
    }
    local_418 = 0;
    while( true ) {
      uVar4 = local_418;
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar7 = (**(code **)(*plVar6 + 0x28))();
      if (uVar7 <= uVar4) break;
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      uVar8 = (**(code **)(*plVar6 + 0x30))(plVar6,local_418);
      (**(code **)(*in_RDI + 0x50))(local_450,in_RDI,uVar8);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_68,local_418);
      dist(in_stack_fffffffffffff868,(TFactor<double> *)in_stack_fffffffffffff860,
           in_stack_fffffffffffff85c);
      Diffs::push(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                (&local_68,local_418);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffff860,
                 (TFactor<double> *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffff860);
      local_418 = local_418 + 1;
    }
    uVar4 = (**(code **)(*in_RDI + 0x30))();
    if (2 < uVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"HAK::doGBP:  maxdiff ");
      dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar15);
      poVar3 = std::operator<<(poVar3," after ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x45] + 1);
      poVar3 = std::operator<<(poVar3," passes");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    in_RDI[0x45] = in_RDI[0x45] + 1;
  }
  dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  if ((double)in_RDI[0x44] < dVar15) {
    dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    in_RDI[0x44] = (long)dVar15;
  }
  lVar2 = (**(code **)(*in_RDI + 0x30))();
  if (lVar2 != 0) {
    dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
    if (dVar15 <= (double)in_RDI[0x3e]) {
      uVar4 = (**(code **)(*in_RDI + 0x30))();
      if (1 < uVar4) {
        std::operator<<((ostream *)&std::cout,"HAK::doGBP:  ");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x45]);
      poVar3 = std::operator<<(poVar3," passes (");
      cVar13 = toc();
      in_stack_fffffffffffff870 = (HAK *)std::ostream::operator<<(poVar3,cVar13 - local_48);
      poVar3 = std::operator<<((ostream *)in_stack_fffffffffffff870," clocks).");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      lVar2 = (**(code **)(*in_RDI + 0x30))();
      if (lVar2 == 1) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"HAK::doGBP:  WARNING: not converged within ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI[0x3f]);
      poVar3 = std::operator<<(poVar3," passes (");
      cVar13 = toc();
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cVar13 - local_48);
      poVar3 = std::operator<<(poVar3," clocks)...final maxdiff:");
      dVar15 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      pvVar14 = (void *)std::ostream::operator<<(poVar3,dVar15);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
    }
  }
  local_8 = Diffs::max((Diffs *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  local_20c = 1;
LAB_00b4abb2:
  Diffs::~Diffs((Diffs *)0xb4abbf);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffff870);
  return local_8;
}

Assistant:

double HAK::doGBP() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

// TODO: FIND OUT WHETHER IT WOULD BE USEFUL TO CATCH NANS BY TRAPPING FLOATING POINT EXCEPTIONS
//      feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW | FE_UNDERFLOW);

        clock_t tic = toc();

        // Check whether counting numbers won't lead to problems
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            assert( grm().nbIR(beta).size() + grm().IR(beta).c() != 0.0 );

        // Keep old beliefs to check convergence
        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

        // Differences in single node beliefs
        Diffs diffs(grm().nrVars(), 1.0);

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta) = _Qa[*alpha].marginal(grm().IR(beta)).divided_by( muba(beta,*alpha) );
                    /* TODO: INVESTIGATE THIS PROBLEM
                     *
                     * In some cases, the muab's can have very large entries because the muba's have very
                     * small entries. This may cause NANs later on (e.g., multiplying large quantities may
                     * result in +inf; normalization then tries to calculate inf / inf which is NAN). 
                     * A fix of this problem would consist in normalizing the messages muab.
                     * However, it is not obvious whether this is a real solution, because it has a
                     * negative performance impact and the NAN's seem to be a symptom of a fundamental
                     * numerical unstability.
                     */
                     muab(*alpha,beta).normalize( grm().normType() ); 
                }

                Factor Qb_new;
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    Qb_new *= muab(*alpha,beta) ^ (1 / (grm().nbIR(beta).size() + grm().IR(beta).c()));
                Qb_new.normalize( grm().normType() );
                if( Qb_new.hasNaNs() ) {
                    // TODO: WHAT TO DO IN THIS CASE?
                    cout << "HAK::doGBP:  Qb_new has NaNs!" << endl;
                    return NAN;
                }
                /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                 *
                 *   _Qb[beta] = Qb_new.makeZero(1e-100);
                 */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qb[beta] = Qb_new; // no damping for double loop
                else
                    _Qb[beta] = (Qb_new^(1.0 - Props.damping)) * (_Qb[beta]^Props.damping);

                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muba(beta,*alpha) = _Qb[beta].divided_by( muab(*alpha,beta) );

                    /* TODO: INVESTIGATE WHETHER THIS HACK (INVENTED BY KEES) TO PREVENT NANS MAKES SENSE 
                     *
                     *   muba(beta,*alpha).makePositive(1e-100);
                     *
                     */

                    Factor Qa_new = grm().OR(*alpha);
                    for( RegionGraph::R_nb_cit gamma = grm().nbOR(*alpha).begin(); gamma != grm().nbOR(*alpha).end(); gamma++ )
                        Qa_new *= muba(*gamma,*alpha);
                    Qa_new ^= (1.0 / grm().OR(*alpha).c());
                    Qa_new.normalize( grm().normType() );
                    if( Qa_new.hasNaNs() ) {
                        cout << "HAK::doGBP:  Qa_new has NaNs!" << endl;
                        return NAN;
                    }
                    /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                     *
                     *   _Qb[beta] = Qb_new.makeZero(1e-100);
                     */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qa[*alpha] = Qa_new; // no damping for double loop
                else
                    // FIXME: GEOMETRIC DAMPING IS SLOW!
                    _Qa[*alpha] = (Qa_new^(1.0 - Props.damping)) * (_Qa[*alpha]^Props.damping);
                }
            }

            // Calculate new single variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor new_belief = belief( grm().var( i ) );
                diffs.push( dist( new_belief, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = new_belief;
            }

            if( Verbose() >= 3 )
                cout << "HAK::doGBP:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "HAK::doGBP:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << "HAK::doGBP:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }